

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

char * yang_read_string(char *input,char *output,int size,int offset,int indent)

{
  char cVar1;
  LY_ERR *pLVar2;
  int local_38;
  int local_34;
  int space;
  int out_index;
  int i;
  int indent_local;
  int offset_local;
  int size_local;
  char *output_local;
  char *input_local;
  
  space = 0;
  local_38 = 0;
  local_34 = offset;
  out_index = indent;
  i = offset;
  indent_local = size;
  _offset_local = output;
  output_local = input;
  do {
    if (indent_local <= space) {
      _offset_local[local_34] = '\0';
      if ((indent_local == local_34) ||
         (_offset_local = (char *)realloc(_offset_local,(long)(local_34 + 1)),
         _offset_local != (char *)0x0)) {
        input_local = _offset_local;
      }
      else {
        pLVar2 = ly_errno_location();
        *pLVar2 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","yang_read_string");
        input_local = (char *)0x0;
      }
      return input_local;
    }
    cVar1 = output_local[space];
    if (cVar1 == '\t') {
LAB_00173834:
      _offset_local[local_34] = output_local[space];
      local_38 = local_38 + 1;
    }
    else if (cVar1 == '\n') {
      local_34 = local_34 - local_38;
      _offset_local[local_34] = '\n';
      local_38 = 0;
      space = read_indent(output_local,out_index,indent_local,space + 1,&local_34,_offset_local);
    }
    else {
      if (cVar1 == ' ') goto LAB_00173834;
      if (cVar1 == '\\') {
        if (output_local[space + 1] == 'n') {
          local_34 = local_34 - local_38;
          _offset_local[local_34] = '\n';
          local_38 = 0;
          space = read_indent(output_local,out_index,indent_local,space + 2,&local_34,_offset_local)
          ;
        }
        else {
          if (output_local[space + 1] == 't') {
            _offset_local[local_34] = '\t';
            local_38 = local_38 + 1;
          }
          else if (output_local[space + 1] == '\\') {
            _offset_local[local_34] = '\\';
          }
          else {
            if ((space + 1 == indent_local) || (output_local[space + 1] != '\"')) {
              ly_vlog(LYE_INSTMT,LY_VLOG_NONE,(void *)0x0,output_local);
              return (char *)0x0;
            }
            _offset_local[local_34] = '\"';
          }
          space = space + 1;
        }
      }
      else {
        _offset_local[local_34] = output_local[space];
        local_38 = 0;
      }
    }
    space = space + 1;
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

char *
yang_read_string(const char *input, char *output, int size, int offset, int indent) {
    int i = 0, out_index = offset, space = 0;

    while (i < size) {
        switch (input[i]) {
        case '\n':
            out_index -= space;
            output[out_index] = '\n';
            space = 0;
            i = read_indent(input, indent, size, i + 1, &out_index, output);
            break;
        case ' ':
        case '\t':
            output[out_index] = input[i];
            ++space;
            break;
        case '\\':
            if (input[i + 1] == 'n') {
                out_index -= space;
                output[out_index] = '\n';
                space = 0;
                i = read_indent(input, indent, size, i + 2, &out_index, output);
            } else if (input[i + 1] == 't') {
                output[out_index] = '\t';
                ++i;
                ++space;
            } else if (input[i + 1] == '\\') {
                output[out_index] = '\\';
                ++i;
            } else if ((i + 1) != size && input[i + 1] == '"') {
                output[out_index] = '"';
                ++i;
            } else {
                /* backslash must not be followed by any other character */
                LOGVAL(LYE_INSTMT, LY_VLOG_NONE, NULL, input);
                return NULL;
            }
            break;
        default:
            output[out_index] = input[i];
            space = 0;
            break;
        }
        ++i;
        ++out_index;
    }
    output[out_index] = '\0';
    if (size != out_index) {
        output = realloc(output, out_index + 1);
        if (!output) {
            LOGMEM;
            return NULL;
        }
    }
    return output;
}